

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall
llm_build_command_r::llm_build_command_r
          (llm_build_command_r *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  float fVar1;
  uint uVar2;
  llama_hparams *plVar3;
  pointer plVar4;
  ggml_tensor *pgVar5;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *cur;
  undefined8 uVar11;
  int il;
  long lVar12;
  long lVar13;
  float __x;
  float fVar14;
  ggml_tensor *local_80;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar3 = (this->super_llm_graph_context).hparams;
  uVar2 = plVar3->n_embd_head_v;
  if (uVar2 != plVar3->n_embd_head_k) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2258,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  fVar1 = plVar3->f_logit_scale;
  local_80 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar5 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  if (0 < (this->super_llm_graph_context).n_layer) {
    __x = (float)uVar2;
    lVar13 = 0;
    lVar12 = 0;
    do {
      il = (int)lVar12;
      pgVar6 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_80,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->attn_norm + lVar13),
                          (ggml_tensor *)0x0,LLM_NORM,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"attn_norm",il);
      pgVar7 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wq + lVar13),pgVar6);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur",il);
      if (*(long *)((long)&((model->layers).
                            super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                            super__Vector_impl_data._M_start)->bq + lVar13) != 0) {
        pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar7);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur",il);
      }
      pgVar8 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wk + lVar13),pgVar6);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il);
      if (*(long *)((long)&((model->layers).
                            super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                            super__Vector_impl_data._M_start)->bk + lVar13) != 0) {
        pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il);
      }
      pgVar9 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wv + lVar13),pgVar6);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Vcur",il);
      if (*(long *)((long)&((model->layers).
                            super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                            super__Vector_impl_data._M_start)->bv + lVar13) != 0) {
        pgVar9 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar9);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Vcur",il);
      }
      pgVar10 = (ggml_tensor *)
                ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar7,uVar2,
                                (this->super_llm_graph_context).n_head,
                                (long)(this->super_llm_graph_context).n_tokens);
      pgVar8 = (ggml_tensor *)
               ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,uVar2,
                               (this->super_llm_graph_context).n_head_kv,
                               (long)(this->super_llm_graph_context).n_tokens);
      pgVar9 = (ggml_tensor *)
               ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar9,uVar2,
                               (this->super_llm_graph_context).n_head_kv);
      pgVar7 = *(ggml_tensor **)
                ((long)&((model->layers).
                         super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                         super__Vector_impl_data._M_start)->attn_q_norm + lVar13);
      if (pgVar7 != (ggml_tensor *)0x0) {
        pgVar10 = llm_graph_context::build_norm
                            (&this->super_llm_graph_context,pgVar10,pgVar7,(ggml_tensor *)0x0,
                             LLM_NORM,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"Qcur",il);
      }
      pgVar10 = (ggml_tensor *)
                ggml_rope_ext((this->super_llm_graph_context).freq_base,
                              (this->super_llm_graph_context).freq_scale,
                              (this->super_llm_graph_context).ext_factor,
                              (this->super_llm_graph_context).attn_factor,
                              (this->super_llm_graph_context).beta_fast,
                              (this->super_llm_graph_context).beta_slow,
                              (this->super_llm_graph_context).ctx0,pgVar10,pgVar5,0,
                              (int)(this->super_llm_graph_context).n_rot,
                              (this->super_llm_graph_context).rope_type,
                              (this->super_llm_graph_context).n_ctx_orig);
      pgVar7 = *(ggml_tensor **)
                ((long)&((model->layers).
                         super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                         super__Vector_impl_data._M_start)->attn_k_norm + lVar13);
      if (pgVar7 != (ggml_tensor *)0x0) {
        pgVar8 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,pgVar8,pgVar7,(ggml_tensor *)0x0,LLM_NORM
                            ,il);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il);
      }
      cur = (ggml_tensor *)
            ggml_rope_ext((this->super_llm_graph_context).freq_base,
                          (this->super_llm_graph_context).freq_scale,
                          (this->super_llm_graph_context).ext_factor,
                          (this->super_llm_graph_context).attn_factor,
                          (this->super_llm_graph_context).beta_fast,
                          (this->super_llm_graph_context).beta_slow,
                          (this->super_llm_graph_context).ctx0,pgVar8,pgVar5,0,
                          (int)(this->super_llm_graph_context).n_rot,
                          (this->super_llm_graph_context).rope_type,
                          (this->super_llm_graph_context).n_ctx_orig);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"Qcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,cur,"Kcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"Vcur",il);
      plVar4 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar7 = *(ggml_tensor **)((long)&plVar4->wo + lVar13);
      pgVar8 = *(ggml_tensor **)((long)&plVar4->bo + lVar13);
      fVar14 = SQRT(__x);
      if (__x < 0.0) {
        fVar14 = sqrtf(__x);
      }
      pgVar7 = llm_graph_context::build_attn
                         (&this->super_llm_graph_context,inp,gf,pgVar7,pgVar8,pgVar10,cur,pgVar9,
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0 / fVar14,il);
      if (lVar12 == (this->super_llm_graph_context).n_layer + -1) {
        pgVar8 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
        pgVar7 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar7,pgVar8);
        local_80 = (ggml_tensor *)
                   ggml_get_rows((this->super_llm_graph_context).ctx0,local_80,pgVar8);
        pgVar6 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar6,pgVar8);
      }
      plVar4 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar6 = llm_graph_context::build_ffn
                         (&this->super_llm_graph_context,pgVar6,
                          *(ggml_tensor **)((long)&plVar4->ffn_up + lVar13),(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar4->ffn_gate + lVar13),
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                          *(ggml_tensor **)((long)&plVar4->ffn_down + lVar13),(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,LLM_FFN_PAR,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_out",il);
      uVar11 = ggml_add((this->super_llm_graph_context).ctx0,pgVar6,local_80);
      pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,uVar11,pgVar7);
      local_80 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar7,il);
      llm_graph_context::cb(&this->super_llm_graph_context,local_80,"l_out",il);
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x4f0;
    } while (lVar12 < (this->super_llm_graph_context).n_layer);
  }
  pgVar5 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_80,model->output_norm,(ggml_tensor *)0x0,
                      LLM_NORM,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar5;
  pgVar5 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar5);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    pgVar5 = (ggml_tensor *)ggml_scale(fVar1,(this->super_llm_graph_context).ctx0,pgVar5);
  }
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar5;
  ggml_build_forward_expand(gf,pgVar5);
  return;
}

Assistant:

llm_build_command_r(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        const float f_logit_scale = hparams.f_logit_scale;

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);
            ggml_tensor * ffn_inp = cur;

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                if (model.layers[il].attn_q_norm) {
                    Qcur = build_norm(Qcur,
                            model.layers[il].attn_q_norm,
                            NULL,
                            LLM_NORM, il);
                    cb(Qcur, "Qcur", il);
                }

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                if (model.layers[il].attn_k_norm) {
                    Kcur = build_norm(Kcur,
                            model.layers[il].attn_k_norm,
                            NULL,
                            LLM_NORM, il);
                    cb(Kcur, "Kcur", il);
                }

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur     = ggml_get_rows(ctx0,     cur, inp_out_ids);
                inpL    = ggml_get_rows(ctx0,    inpL, inp_out_ids);
                ffn_inp = ggml_get_rows(ctx0, ffn_inp, inp_out_ids);
            }

            ggml_tensor * attn_out = cur;

            // feed-forward network
            {
                cur = build_ffn(ffn_inp,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            // add together residual + FFN + self-attention
            cur = ggml_add(ctx0, cur, inpL);
            cur = ggml_add(ctx0, cur, attn_out);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        if (f_logit_scale) {
            cur = ggml_scale(ctx0, cur, f_logit_scale);
        }

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }